

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O0

void __thiscall
InstructionSet::x86::Flags::
set_from<unsigned_int,(InstructionSet::x86::Flag)0,(InstructionSet::x86::Flag)1,(InstructionSet::x86::Flag)3>
          (Flags *this,uint value)

{
  uint uVar1;
  uint uVar2;
  const_iterator pFVar3;
  int32_t iVar4;
  Flag flag;
  const_iterator __end0;
  const_iterator __begin0;
  undefined4 local_38;
  undefined4 local_34;
  initializer_list<InstructionSet::x86::Flag> local_30;
  initializer_list<InstructionSet::x86::Flag> *local_20;
  initializer_list<InstructionSet::x86::Flag> *__range3;
  Flags *pFStack_10;
  uint value_local;
  Flags *this_local;
  
  __begin0._4_4_ = 0;
  local_38 = 1;
  local_34 = 3;
  local_30._M_array = (iterator)((long)&__begin0 + 4);
  local_30._M_len = 3;
  local_20 = &local_30;
  __range3._4_4_ = value;
  pFStack_10 = this;
  __end0 = std::initializer_list<InstructionSet::x86::Flag>::begin(local_20);
  pFVar3 = std::initializer_list<InstructionSet::x86::Flag>::end(local_20);
  for (; uVar1 = __range3._4_4_, __end0 != pFVar3; __end0 = __end0 + 1) {
    switch(*__end0) {
    case Carry:
      this->carry_ = __range3._4_4_;
      break;
    case AuxiliaryCarry:
      this->auxiliary_carry_ = __range3._4_4_;
      break;
    case Sign:
      uVar2 = Numeric::top_bit<unsigned_int>();
      this->sign_ = uVar1 & uVar2;
      break;
    case Overflow:
      this->overflow_ = __range3._4_4_;
      break;
    case Trap:
      this->trap_ = __range3._4_4_;
      break;
    case Interrupt:
      this->interrupt_ = __range3._4_4_;
      break;
    case Direction:
      iVar4 = 1;
      if (__range3._4_4_ != 0) {
        iVar4 = -1;
      }
      this->direction_ = iVar4;
      break;
    case Zero:
      this->zero_ = __range3._4_4_;
      break;
    case ParityOdd:
      this->parity_ = __range3._4_4_;
    }
  }
  return;
}

Assistant:

void set_from(IntT value) {
			for(const auto flag: {flags...}) {
				switch(flag) {
					default: break;
					case Flag::Zero:			zero_ = value;								break;
					case Flag::Sign:			sign_ = value & Numeric::top_bit<IntT>();	break;
					case Flag::ParityOdd:		parity_ = value;							break;
					case Flag::Carry:			carry_ = value;								break;
					case Flag::AuxiliaryCarry:	auxiliary_carry_ = value;					break;
					case Flag::Overflow:		overflow_ = value;							break;
					case Flag::Interrupt:		interrupt_ = value;							break;
					case Flag::Trap:			trap_ = value;								break;
					case Flag::Direction:		direction_ = value ? -1 : 1;				break;
				}
			}
		}